

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QPluginParsedMetaData>::emplace<QPluginParsedMetaData_const&>
          (QGenericArrayOps<QPluginParsedMetaData> *this,qsizetype i,QPluginParsedMetaData *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  long in_RSI;
  QArrayDataPointer<QPluginParsedMetaData> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QPluginParsedMetaData tmp;
  QPluginParsedMetaData *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar3;
  Inserter *in_stack_ffffffffffffff60;
  GrowthPosition in_stack_ffffffffffffff6c;
  undefined2 in_stack_ffffffffffffff74;
  byte bVar4;
  Inserter local_70;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QPluginParsedMetaData>::needsDetach
                    ((QArrayDataPointer<QPluginParsedMetaData> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QPluginParsedMetaData>::freeSpaceAtEnd(in_RDI), qVar2 != 0)) {
      QArrayDataPointer<QPluginParsedMetaData>::end
                ((QArrayDataPointer<QPluginParsedMetaData> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      QPluginParsedMetaData::QPluginParsedMetaData
                ((QPluginParsedMetaData *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00455699;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QPluginParsedMetaData>::freeSpaceAtBegin(in_RDI), qVar2 != 0)) {
      QArrayDataPointer<QPluginParsedMetaData>::begin
                ((QArrayDataPointer<QPluginParsedMetaData> *)0x45551a);
      QPluginParsedMetaData::QPluginParsedMetaData
                ((QPluginParsedMetaData *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00455699;
    }
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPluginParsedMetaData::QPluginParsedMetaData
            ((QPluginParsedMetaData *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  uVar3 = in_RDI->size != 0 && in_RSI == 0;
  bVar4 = uVar3;
  QArrayDataPointer<QPluginParsedMetaData>::detachAndGrow
            ((QArrayDataPointer<QPluginParsedMetaData> *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffff74,(uint)(byte)uVar3))),
             in_stack_ffffffffffffff6c,(qsizetype)in_stack_ffffffffffffff60,
             (QPluginParsedMetaData **)in_RDI,
             (QArrayDataPointer<QPluginParsedMetaData> *)CONCAT17(uVar3,in_stack_ffffffffffffff50));
  if ((bVar4 & 1) == 0) {
    Inserter::Inserter(&local_70,in_RDI);
    Inserter::insertOne(in_stack_ffffffffffffff60,(qsizetype)in_RDI,
                        (QPluginParsedMetaData *)CONCAT17(uVar3,in_stack_ffffffffffffff50));
    Inserter::~Inserter(&local_70);
  }
  else {
    QArrayDataPointer<QPluginParsedMetaData>::begin
              ((QArrayDataPointer<QPluginParsedMetaData> *)0x4555f1);
    QPluginParsedMetaData::QPluginParsedMetaData
              ((QPluginParsedMetaData *)CONCAT17(uVar3,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QPluginParsedMetaData::~QPluginParsedMetaData((QPluginParsedMetaData *)0x455699);
LAB_00455699:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }